

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

void __thiscall ON_2fPoint::Transform(ON_2fPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (double)this->x;
  dVar4 = (double)this->y;
  dVar5 = xform->m_xform[3][0] * dVar3 + xform->m_xform[3][1] * dVar4 + xform->m_xform[3][3];
  dVar1 = xform->m_xform[1][1];
  dVar2 = xform->m_xform[1][0];
  dVar6 = (double)(~-(ulong)(dVar5 != 0.0) & (ulong)dVar5 |
                  (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
  dVar5 = xform->m_xform[1][3];
  this->x = (float)((xform->m_xform[0][0] * dVar3 + xform->m_xform[0][1] * dVar4 +
                    xform->m_xform[0][3]) * dVar6);
  this->y = (float)((dVar3 * dVar2 + dVar4 * dVar1 + dVar5) * dVar6);
  return;
}

Assistant:

void ON_2fPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][3]);
  x = (float)xx;
  y = (float)yy;
}